

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O2

string * DirUtils::GetLastPath(string *__return_storage_ptr__,string *p)

{
  long lVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)p->_M_string_length;
  do {
    if ((int)uVar2 < 1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)p);
      return __return_storage_ptr__;
    }
    lVar1 = uVar2 - 1;
    uVar2 = uVar2 - 1;
  } while ((p->_M_dataplus)._M_p[lVar1] != '/');
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)p);
  return __return_storage_ptr__;
}

Assistant:

string DirUtils::GetLastPath(const string& p){
	int l = p.length();
	for(int i = l - 1; i >= 0; i--){
		if(p[i] == '/')
			return p.substr(i + 1, l - i - 1);
	}
	return p;
}